

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O3

void my_canvas_draw_new(t_my_canvas *x,_glist *glist)

{
  _glist *in_RAX;
  _glist *p_Var1;
  char *tags [4];
  char tag [128];
  char tag_object [128];
  
  p_Var1 = glist_getcanvas(in_RAX);
  tags[0] = tag_object;
  tags[2] = "label";
  tags[3] = "text";
  tags[1] = tag;
  sprintf(tags[0],"%lxOBJ",x);
  sprintf(tag,"%lxRECT",x);
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,0,0,"-tags",2,tags);
  sprintf(tag,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,0,0,"-tags",2,tags);
  sprintf(tag,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",4,tags);
  my_canvas_draw_config(x,glist);
  return;
}

Assistant:

static void my_canvas_draw_new(t_my_canvas *x, t_glist *glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    char tag_object[128], tag[128];
    char *tags[] = {tag_object, tag, "label", "text"};
    sprintf(tag_object, "%lxOBJ", x);

    sprintf(tag, "%lxRECT", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
        0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
        0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 4, tags);

    my_canvas_draw_config(x, glist);
}